

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DetachedStateBase.h
# Opt level: O2

void __thiscall
Js::ArrayBufferDetachedStateBase::DiscardStateBase<void(*)(unsigned_char*)>
          (ArrayBufferDetachedStateBase *this,_func_void_uchar_ptr *freeFunction)

{
  RefCountedBuffer *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  long lVar4;
  
  this_00 = this->buffer;
  if (this_00 != (RefCountedBuffer *)0x0) {
    this->buffer = (RefCountedBuffer *)0x0;
    if (this_00->buffer == (Type)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./DetachedStateBase.h"
                                  ,0x57,"(local->GetBuffer())","local->GetBuffer()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      if (this_00->buffer == (Type)0x0) goto LAB_00a02758;
    }
    lVar4 = RefCountedBuffer::Release(this_00);
    if (lVar4 == 0) {
      (*freeFunction)(this_00->buffer);
      Memory::
      DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Js::RefCountedBuffer>
                (&Memory::HeapAllocator::Instance,this_00);
    }
  }
LAB_00a02758:
  this->bufferLength = 0;
  return;
}

Assistant:

void DiscardStateBase(TFreeFn freeFunction)
        {
            // this function will be called in the case where transferable object is going away and current arraybuffer is not claimed.

            if (this->buffer != nullptr)
            {
                RefCountedBuffer *local = this->buffer;
                this->buffer = nullptr;

                Assert(local->GetBuffer());

                if (local->GetBuffer() != nullptr)
                {
                    long ref = local->Release();
                    // The ref may not be 0, as we may have put the object in the DelayFree buffer list.
                    if (ref == 0)
                    {
                        freeFunction(local->GetBuffer());
                        HeapDelete(local);
                    }
                }
            }

            this->bufferLength = 0;
        }